

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callbacks.cpp
# Opt level: O0

void celero::impl::ExperimentResultComplete(shared_ptr<celero::ExperimentResult> *x)

{
  bool bVar1;
  reference this;
  shared_ptr<celero::ExperimentResult> local_40;
  reference local_30;
  function<void_(std::shared_ptr<celero::ExperimentResult>)> *i;
  iterator __end1;
  iterator __begin1;
  vector<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>,_std::allocator<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>_>_>
  *__range1;
  shared_ptr<celero::ExperimentResult> *x_local;
  
  __end1 = std::
           vector<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>,_std::allocator<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>_>_>
           ::begin(&ExperimentResultFunctions);
  i = (function<void_(std::shared_ptr<celero::ExperimentResult>)> *)
      std::
      vector<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>,_std::allocator<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>_>_>
      ::end(&ExperimentResultFunctions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>_*,_std::vector<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>,_std::allocator<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>_>_>_>
                                *)&i);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>_*,_std::vector<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>,_std::allocator<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>_>_>_>
           ::operator*(&__end1);
    local_30 = this;
    std::shared_ptr<celero::ExperimentResult>::shared_ptr(&local_40,x);
    std::function<void_(std::shared_ptr<celero::ExperimentResult>)>::operator()(this,&local_40);
    std::shared_ptr<celero::ExperimentResult>::~shared_ptr(&local_40);
    __gnu_cxx::
    __normal_iterator<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>_*,_std::vector<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>,_std::allocator<std::function<void_(std::shared_ptr<celero::ExperimentResult>)>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void celero::impl::ExperimentResultComplete(std::shared_ptr<celero::ExperimentResult> x)
{
	for(auto& i : ExperimentResultFunctions)
	{
		i(x);
	}
}